

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAPSFile.cpp
# Opt level: O1

bool __thiscall CAPSFile::DecodeData(CAPSFile *this,DataChunks item,IDisk *disk)

{
  uchar byte;
  byte bVar1;
  pointer paVar2;
  pointer paVar3;
  IDisk *pIVar4;
  byte bVar5;
  int iVar6;
  uint size;
  undefined8 uVar7;
  undefined4 extraout_var;
  ulong uVar8;
  ulong uVar9;
  byte bVar10;
  byte *pbVar11;
  MFMTrack **ppMVar12;
  uint uVar13;
  ulong uVar14;
  int in_R8D;
  uint uVar15;
  uint in_R9D;
  uint uVar16;
  int iVar17;
  uint unaff_R13D;
  uchar *puVar18;
  long lVar19;
  long lVar20;
  bool bVar21;
  uint gap_offset;
  uint local_bc;
  undefined8 local_b0;
  undefined8 local_a8;
  uint local_a0;
  uint local_9c;
  IDisk *local_98;
  uint local_90;
  int local_8c;
  undefined8 local_88;
  byte *local_80;
  uint local_74;
  CAPSFile *local_70;
  uchar *local_68;
  uint local_5c;
  uint local_58;
  uint local_54;
  uchar *local_50;
  uchar *local_48;
  ulong local_40;
  ulong local_38;
  
  local_90 = item.size;
  if (item.size != 0) {
    paVar2 = (this->list_imge_).
             super__Vector_base<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>._M_impl.
             super__Vector_impl_data._M_start;
    paVar3 = (this->list_imge_).
             super__Vector_base<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (paVar2 == paVar3) {
      bVar21 = false;
    }
    else {
      bVar21 = false;
      do {
        if (paVar2->data_key == item.data_id) {
          local_bc = paVar2->track_number;
          in_R8D = paVar2->side;
          unaff_R13D = paVar2->start_bit_pos;
          in_R9D = paVar2->block_count;
          bVar21 = true;
        }
      } while ((paVar2 + 1 != paVar3) && (paVar2 = paVar2 + 1, !bVar21));
    }
    if (!bVar21) {
      return false;
    }
    if (item.size < in_R9D << 5) {
      return false;
    }
    if (in_R9D != 0) {
      local_50 = item.buffer;
      ppMVar12 = &disk->side_[in_R8D].tracks;
      lVar20 = (long)(int)local_bc;
      local_54 = 0;
      local_58 = 0;
      local_98 = disk;
      local_70 = this;
      local_5c = in_R9D;
      do {
        local_a0 = *(uint *)(local_50 + (ulong)local_54 + 4);
        local_9c = 0;
        if (local_70->encoder_type_ != 1) {
          uVar15 = *(uint *)(local_50 + (ulong)local_54 + 8);
          local_9c = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                     uVar15 << 0x18;
        }
        byte = local_50[(ulong)local_54 + 0x1b];
        local_80 = (byte *)(ulong)local_50[(ulong)local_54 + 0x1f];
        bVar10 = local_50[(ulong)local_54 + 0x1e];
        local_68 = (uchar *)CONCAT44(local_68._4_4_,(uint)local_50[(ulong)local_54 + 0x1d]);
        bVar1 = local_50[(ulong)local_54 + 0x1c];
        puVar18 = local_50 + local_9c;
        local_9c = 0;
        uVar7 = 0;
        local_b0 = 0;
        local_a8 = 0;
        local_74 = (uint)local_50[(ulong)local_54 + 0x17];
        if ((local_50[(ulong)local_54 + 0x17] & 1) != 0) {
          iVar6 = (*local_70->_vptr_CAPSFile[8])
                            (local_70,&local_a8,puVar18,&local_9c,(ulong)local_90);
          uVar7 = CONCAT44(extraout_var,iVar6);
        }
        local_88 = uVar7;
        if ((local_74 & 2) == 0) {
          local_8c = 0;
        }
        else {
          local_8c = (*local_70->_vptr_CAPSFile[8])
                               (local_70,&local_b0,puVar18,&local_9c,(ulong)local_90);
        }
        iVar6 = (int)local_80;
        local_80 = local_50 +
                   (int)((uint)bVar10 * 0x100 + iVar6 | (int)local_68 * 0x10000 |
                        (uint)bVar1 * 0x1000000);
        bVar5 = *local_80;
        if (bVar5 != 0) {
          local_48 = local_50 +
                     (int)((uint)bVar10 * 0x100 + iVar6 +
                          (uint)bVar1 * 0x1000000 + (int)local_68 * 0x10000);
          uVar14 = 1;
          do {
            uVar9 = 0;
            if (0x1f < bVar5) {
              pbVar11 = local_48 + (int)uVar14;
              iVar6 = (uint)(bVar5 >> 5) * 8 + -8;
              uVar9 = 0;
              do {
                uVar9 = (ulong)((int)uVar9 + ((uint)*pbVar11 << ((byte)iVar6 & 0x1f)));
                pbVar11 = pbVar11 + 1;
                iVar6 = iVar6 + -8;
              } while (iVar6 != -8);
              uVar14 = (ulong)((int)uVar14 + (uint)(bVar5 >> 5));
            }
            bVar5 = bVar5 & 0x1f;
            iVar6 = (int)uVar9;
            if ((local_74 & 4) == 0) {
              if (bVar5 == 5) {
                if (0 < iVar6) {
                  iVar17 = 0;
                  local_40 = uVar14;
                  do {
                    if ((iVar17 < 0x1001) && (iVar6 == 0x200)) {
                      unaff_R13D = IDisk::AddByteToSpecificTrack
                                             (local_98,in_R8D,local_bc,unaff_R13D,0xe5,0x10);
                      iVar17 = iVar17 + 0xf;
                      uVar14 = local_40;
                    }
                    else {
                      uVar9 = (ulong)unaff_R13D;
                      unaff_R13D = unaff_R13D + 1;
                      (*ppMVar12)[lVar20].bitfield[uVar9] = '\x04';
                      if ((*ppMVar12)[lVar20].size <= unaff_R13D) {
                        unaff_R13D = 0;
                      }
                    }
                    iVar17 = iVar17 + 1;
                  } while (iVar17 < iVar6 * 0x10);
                }
              }
              else if (0 < iVar6) {
                local_68 = local_48 + (int)uVar14;
                lVar19 = 0;
                local_38 = uVar9;
                do {
                  if (bVar5 == 1) {
                    unaff_R13D = IDisk::AddMFMByteToAllTrack
                                           (local_98,in_R8D,local_bc,unaff_R13D,local_68[lVar19],8);
                  }
                  else {
                    unaff_R13D = IDisk::AddByteToSpecificTrack
                                           (local_98,in_R8D,local_bc,unaff_R13D,local_68[lVar19],
                                            0x10);
                  }
                  lVar19 = lVar19 + 1;
                } while ((int)local_38 != (int)lVar19);
                uVar14 = (ulong)(uint)((int)uVar14 + (int)lVar19);
              }
            }
            else {
              while (iVar6 != 0) {
                iVar6 = (int)uVar9;
                if (bVar5 == 5) {
                  if (iVar6 < 1) {
                    uVar8 = 0;
                  }
                  else {
                    do {
                      uVar8 = (ulong)unaff_R13D;
                      unaff_R13D = unaff_R13D + 1;
                      (*ppMVar12)[lVar20].bitfield[uVar8] = '\x04';
                      uVar8 = 0;
                      if ((*ppMVar12)[lVar20].size <= unaff_R13D) {
                        unaff_R13D = 0;
                      }
                      uVar15 = (int)uVar9 - 1;
                      uVar9 = (ulong)uVar15;
                    } while (uVar15 != 0);
                  }
                }
                else {
                  uVar15 = (int)uVar14 + 1;
                  bVar10 = local_80[(int)uVar14];
                  if (bVar5 == 1) {
                    if (iVar6 < 9) {
                      if (0 < iVar6) {
                        uVar13 = 7;
                        do {
                          uVar14 = (ulong)unaff_R13D;
                          unaff_R13D = unaff_R13D + 1;
                          (*ppMVar12)[lVar20].bitfield[uVar14] =
                               (bVar10 >> (uVar13 & 0x1f) & 1) != 0;
                          if ((*ppMVar12)[lVar20].size <= unaff_R13D) {
                            unaff_R13D = 0;
                          }
                          iVar17 = iVar6 + uVar13;
                          uVar13 = uVar13 - 1;
                        } while (iVar17 != 8);
                      }
                      uVar8 = 0;
                      uVar14 = (ulong)uVar15;
                    }
                    else {
                      uVar13 = 7;
                      do {
                        uVar14 = (ulong)unaff_R13D;
                        unaff_R13D = unaff_R13D + 1;
                        (*ppMVar12)[lVar20].bitfield[uVar14] = (bVar10 >> (uVar13 & 0x1f) & 1) != 0;
                        if ((*ppMVar12)[lVar20].size <= unaff_R13D) {
                          unaff_R13D = 0;
                        }
                        bVar21 = uVar13 != 0;
                        uVar13 = uVar13 - 1;
                      } while (bVar21);
LAB_0012e240:
                      uVar14 = (ulong)uVar15;
                      uVar8 = (ulong)(iVar6 - 8);
                    }
                  }
                  else {
                    uVar14 = (ulong)uVar15;
                    if (7 < iVar6) {
                      unaff_R13D = IDisk::AddByteToSpecificTrack
                                             (local_98,in_R8D,local_bc,unaff_R13D,bVar10,0x10);
                      goto LAB_0012e240;
                    }
                    unaff_R13D = IDisk::AddByteToSpecificTrack
                                           (local_98,in_R8D,local_bc,unaff_R13D,bVar10,iVar6 * 2);
                    uVar8 = 0;
                  }
                }
                uVar9 = uVar8;
                iVar6 = (int)uVar8;
              }
            }
            iVar6 = (int)uVar14;
            uVar14 = (ulong)(iVar6 + 1);
            bVar5 = local_80[iVar6];
          } while (bVar5 != 0);
        }
        pIVar4 = local_98;
        uVar15 = local_a0 >> 0x18 | (local_a0 & 0xff0000) >> 8 | (local_a0 & 0xff00) << 8 |
                 local_a0 << 0x18;
        if (local_70->encoder_type_ == 1) {
          if (uVar15 != 0) {
            uVar13 = 0;
            do {
              uVar16 = uVar15 - uVar13;
              size = 0x10;
              if (uVar16 < 0x10) {
                uVar13 = uVar15;
                size = uVar16;
              }
              unaff_R13D = IDisk::AddByteToSpecificTrack
                                     (pIVar4,in_R8D,local_bc,unaff_R13D,byte,size);
              uVar13 = uVar13 + 0x10;
            } while (uVar13 < uVar15);
          }
        }
        else {
          uVar13 = (int)local_a8 * 2 + (uint)local_b0 * 2;
          if (uVar15 < uVar13) {
            local_a8 = CONCAT44(local_a8._4_4_,uVar15 + (uint)local_b0 * -2 >> 1);
          }
          else if (uVar13 < uVar15) {
            bVar10 = (uint)local_b0 == 0 & (byte)local_8c;
            if ((char)local_88 == '\x01' && (int)local_a8 == 0) {
              if (bVar10 == 0) {
                local_a8 = CONCAT44(local_a8._4_4_,uVar15 + (uint)local_b0 * -2 >> 1);
              }
              else {
                local_a8 = CONCAT44(local_a8._4_4_,uVar15 >> 2);
                local_b0 = CONCAT44(local_b0._4_4_,uVar15 + (uVar15 >> 2) * -2 >> 1);
              }
            }
            else if (bVar10 != 0) {
              local_b0 = CONCAT44(local_b0._4_4_,uVar15 + (int)local_a8 * -2 >> 1);
            }
          }
          uVar14 = local_b0;
          local_a0 = uVar15;
          if ((char)local_88 != '\0') {
            if ((int)local_a8 == 0) {
              if ((uint)local_b0 == 0) {
                local_b0 = CONCAT44(local_b0._4_4_,uVar15 >> 2);
                uVar7 = local_b0;
                local_a8 = CONCAT44(local_a8._4_4_,uVar15 >> 2);
                local_b0._6_2_ = SUB82(uVar14,6);
                local_b0._0_6_ = CONCAT15(byte,(int5)uVar7);
              }
              else {
                local_a8 = CONCAT44(local_a8._4_4_,(uVar15 >> 1) - (uint)local_b0);
              }
            }
            uVar15 = (int)local_a8 * 2;
            if (uVar15 != 0) {
              uVar13 = 0;
              do {
                if (uVar15 - uVar13 < 0x10) {
                  unaff_R13D = IDisk::AddByteToSpecificTrack
                                         (pIVar4,in_R8D,local_bc,unaff_R13D,local_a8._5_1_,
                                          uVar15 - uVar13);
                  uVar13 = (int)local_a8 * 2;
                }
                else if (local_a8._4_1_ == '\b') {
                  unaff_R13D = IDisk::AddByteToSpecificTrack
                                         (pIVar4,in_R8D,local_bc,unaff_R13D,local_a8._5_1_,0x10);
                }
                uVar13 = uVar13 + 0x10;
                uVar15 = (int)local_a8 * 2;
              } while (uVar13 < uVar15);
            }
          }
          uVar15 = local_a0 + ((uint)local_b0 + (int)local_a8) * -2;
          if ((((uint)local_b0 + (int)local_a8) * 2 <= local_a0 && uVar15 != 0) && (0 < (int)uVar15)
             ) {
            uVar13 = 0x10;
            iVar17 = 0;
            iVar6 = 0;
            local_a0 = uVar15;
            do {
              uVar15 = local_a0;
              if ((int)uVar13 < (int)local_a0) {
                uVar15 = uVar13;
              }
              iVar6 = iVar6 + 0x10;
              unaff_R13D = IDisk::AddByteToSpecificTrack
                                     (local_98,in_R8D,local_bc,unaff_R13D,'N',uVar15 + iVar17);
              uVar13 = uVar13 + 0x10;
              iVar17 = iVar17 + -0x10;
            } while (iVar6 < (int)local_a0);
          }
          pIVar4 = local_98;
          if ((byte)local_8c != '\0') {
            uVar15 = (uint)local_b0 & 7;
            if ((local_b0 & 7) == 0) {
              uVar15 = 0;
            }
            else {
              unaff_R13D = IDisk::AddByteToSpecificTrack
                                     (local_98,in_R8D,local_bc,unaff_R13D,local_b0._5_1_,uVar15);
            }
            uVar13 = (uint)local_b0 * 2;
            if (uVar15 < uVar13) {
              do {
                if (uVar13 - uVar15 < 0x10) {
                  unaff_R13D = IDisk::AddByteToSpecificTrack
                                         (pIVar4,in_R8D,local_bc,unaff_R13D,local_b0._5_1_,
                                          uVar13 - uVar15);
                  uVar15 = (uint)local_b0 * 2;
                }
                else if (local_b0._4_1_ == '\b') {
                  unaff_R13D = IDisk::AddByteToSpecificTrack
                                         (pIVar4,in_R8D,local_bc,unaff_R13D,local_b0._5_1_,0x10);
                }
                uVar15 = uVar15 + 0x10;
                uVar13 = (uint)local_b0 * 2;
              } while (uVar15 < uVar13);
            }
          }
        }
        local_54 = local_54 + 0x20;
        local_58 = local_58 + 1;
      } while (local_58 != local_5c);
    }
  }
  return true;
}

Assistant:

bool CAPSFile::DecodeData(DataChunks item, IDisk* disk)
{
   unsigned int offset = 0;
   unsigned char* block = item.buffer;
   unsigned char* data_block = &block[offset];

   int total_total = 0;
   // Now, extra data blocks ?
   if (item.size != 0)
   {
      // Get block count from IMGE
      ImgeItem imge_item;
      bool found = false;
      for (std::vector<ImgeItem>::iterator it = list_imge_.begin(); it != list_imge_.end() && (!found); it++)
      {
         if (it->data_key == item.data_id)
         {
            // Found !
            imge_item = *it;
            found = true;
         }
      }
      if (!found || (imge_item.block_count * 32 > item.size))
      {
         // Error !
         return false;
         // TODO : Save this chunk for later use ?
         //break;
      }
      else
      {
         int total_data = 0;

         unsigned int index_track = imge_item.start_bit_pos;
         for (DWORD i = 0; i < imge_item.block_count; i++)
         {
            // Read descriptors
            int data_bits = ExtractInt(&block[offset]);
            offset += 4;
            unsigned int gap_bits = ExtractInt(&block[offset]);
            offset += 4;
            int data_bytes = 0;
            int gap_bytes = 0;
            unsigned int gap_offset = 0;
            int cell_type = 0;
            if (encoder_type_ == 1)
            {
               data_bytes = ExtractInt(&block[offset]);
               offset += 4;
               gap_bytes = ExtractInt(&block[offset]);
               offset += 4;
            }
            else
            {
               gap_offset = ExtractInt(&block[offset]);
               offset += 4;
               cell_type = ExtractInt(&block[offset]);
               offset += 4;
            }
            int encoder_type = ExtractInt(&block[offset]);
            offset += 4;
            int block_flags = ExtractInt(&block[offset]);
            offset += 4;
            int gap_default = ExtractInt(&block[offset]);
            offset += 4;
            int data_offset = ExtractInt(&block[offset]);
            offset += 4;

            // Now, remaining datas
            unsigned char* current_block_gap = &data_block[gap_offset];
            unsigned char* current_block_data = &data_block[data_offset];
            data_offset = 0;
            gap_offset = 0;
            // Do we have backward gap ?
            // Read Forward / Backward streams
            StreamItem backward_stream = {0};
            StreamItem forward_stream = {0};

            unsigned int total_gap = 0;
            bool forward_gap = false;
            bool backward_gap = false;
            if ((block_flags & 0x1) == 0x1)
            {
               // Ok, Forward stream
               forward_gap = GetStreamGapItem(&forward_stream, current_block_gap, gap_offset, item.size);
            }
            if ((block_flags & 0x2) == 0x2)
            {
               // Ok, backward stream
               backward_gap = GetStreamGapItem(&backward_stream, current_block_gap, gap_offset, item.size);
            }

            // data
            unsigned char b = current_block_data[data_offset++];
            unsigned int offset_before = index_track;
            while (b != 0)
            {
               int size_width = b >> 5;
               int data_type = b & 0x1F;
               int data_size = 0;
               for (int j = 0; j < size_width; j++)
               {
                  data_size += (current_block_data[data_offset++] << (8 * (size_width - (j + 1))));
               }
               if ((block_flags & 0x4) == 0x4)
               {
                  // in bits
                  while (data_size != 0)
                  {
                     if (data_type == 5)
                     {
                        for (int c = 0; c < data_size; c++)
                        {
                           disk->side_[imge_item.side].tracks[imge_item.track_number].bitfield[index_track++] =
                              BIT_WEAK;
                           if (index_track >= disk->side_[imge_item.side].tracks[imge_item.track_number].size)
                              index_track = 0;
                        }
                        data_size = 0;
                     }
                     else
                     {
                        unsigned char bitfield = current_block_data[data_offset++];
                        if (data_type == 1)
                        {
                           if (data_size > 8)
                           {
                              int maxbits = 8;
                              for (int d = 0; d < 8; d++)
                              {
                                 maxbits--;
                                 int val = (bitfield >> maxbits) & 0x1;
                                 disk->side_[imge_item.side].tracks[imge_item.track_number].bitfield[index_track++] =
                                    val;
                                 if (index_track >= disk->side_[imge_item.side].tracks[imge_item.track_number].size)
                                    index_track = 0;
                              }
                              data_size -= 8;
                           }
                           else
                           {
                              int maxbits = 8;
                              for (int d = 0; d < data_size; d++)
                              {
                                 maxbits--;
                                 int val = (bitfield >> maxbits) & 0x1;
                                 disk->side_[imge_item.side].tracks[imge_item.track_number].bitfield[index_track++] =
                                    val;
                                 if (index_track >= disk->side_[imge_item.side].tracks[imge_item.track_number].size)
                                    index_track = 0;
                              }
                              data_size = 0;
                           }
                        }
                           // in bytes
                        else
                        {
                           // Convert to MFM
                           if (data_size >= 8)
                           {
                              index_track = disk->AddByteToSpecificTrack(
                                 imge_item.side, imge_item.track_number, index_track, bitfield);
                              data_size -= 8;
                           }
                           else
                           {
                              // Convert to MFM
                              index_track = disk->AddByteToSpecificTrack(
                                 imge_item.side, imge_item.track_number, index_track, bitfield, data_size * 2);
                              data_size -= data_size;
                           }
                        }
                     }
                  }
               }
               else
               {
                  // in bytes
                  if (data_type == 5)
                  {
                     // weak bit ??
                     unsigned char byte = 0xE5;

                     for (int c = 0; c < data_size * 16; c++)
                     {
                        if (c > 256 * 16 || data_size != 512)
                        {
                           disk->side_[imge_item.side].tracks[imge_item.track_number].bitfield[index_track++] =
                              BIT_WEAK;
                           if (index_track >= disk->side_[imge_item.side].tracks[imge_item.track_number].size)
                              index_track = 0;
                        }
                        else
                        {
                           index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number,
                                                                      index_track, byte);
                           c += 15;
                        }
                     }
                     //dataoffset++;
                  }
                  else
                  {
                     if (data_type == 3)
                     {
                        //totalGap += dataSize*16;
                     }
                     for (int c = 0; c < data_size; c++)
                     {
                        unsigned char byte = 0;
                        {
                           byte = current_block_data[data_offset++];

                           if (data_type == 1)
                           {
                              index_track = disk->AddMFMByteToAllTrack(imge_item.side, imge_item.track_number,
                                                                       index_track, byte, 8);
                           }
                           else
                           {
                              index_track = disk->AddByteToSpecificTrack(
                                 imge_item.side, imge_item.track_number, index_track, byte);
                           }
                        }
                     }
                  }
               }
               b = current_block_data[data_offset++];
            }
            if (offset_before > index_track)
            {
               offset_before = offset_before - disk->side_[imge_item.side].tracks[imge_item.track_number].size;
            }
            total_total += data_bits; //indexTrack - offsetBefore;
            total_data += data_bits;
            if ((data_bits != index_track - offset_before)
               && ((index_track != offset_before)
                  || (data_bits != disk->side_[imge_item.side].tracks[imge_item.track_number].size)
               )
            )
            {
               //
               int dbg = 1;
            }


            if (encoder_type_ == 1)
            {
               // GAP via CAPS encoding
               for (unsigned int c = 0; c < gap_bits; c += 16)
               {
                  if (gap_bits - c < 16)
                  {
                     // Add what we need to
                     index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number, index_track,
                                                                gap_default, (gap_bits - c));

                     // then quit
                     total_gap += gap_bits - c;
                     c = gap_bits;
                  }
                  else
                  {
                     {
                        index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number, index_track,
                                                                   gap_default);

                        if (index_track > imge_item.start_bit_pos && index_track < imge_item.start_bit_pos + 16)
                        {

                        }

                        total_gap += 16;
                     }
                  }
               }
            }
            else
            {
               if (forward_stream.size * 2 + backward_stream.size * 2 > gap_bits)
               {
                  // Remove from forward
                  forward_stream.size = (gap_bits - backward_stream.size * 2) / 2;
               }
               else
               {
                  if (forward_stream.size * 2 + backward_stream.size * 2 < gap_bits)
                  {
                     // Adjust :
                     //
                     if (forward_gap && forward_stream.size == 0)
                     {
                        if (backward_gap && backward_stream.size == 0)
                        {
                           forward_stream.size = gap_bits / 4;
                           backward_stream.size = (gap_bits - forward_stream.size * 2) / 2;
                        }
                        else
                        {
                           forward_stream.size = (gap_bits - backward_stream.size * 2) / 2;
                        }
                     }
                     else
                     {
                        if (backward_gap && backward_stream.size == 0)
                        {
                           backward_stream.size = (gap_bits - forward_stream.size * 2) / 2;
                        }
                     }
                  }
               }
               if (forward_gap)
               {
                  if (forward_stream.size == 0)
                  {
                     if (backward_stream.size != 0)
                     {
                        forward_stream.size = gap_bits / 2 - backward_stream.size;
                     }
                     else
                     {
                        forward_stream.size = backward_stream.size = gap_bits / 4;
                        backward_stream.sample = gap_default;
                     }
                     //forwardStream.Sample = gapDefault;
                  }
                  for (unsigned int c = 0; c < forward_stream.size * 2; c += 16)
                  {
                     if (forward_stream.size * 2 - c < 16)
                     {
                        // Add what we need to
                        index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number, index_track,
                                                                   forward_stream.sample,
                                                                   (forward_stream.size * 2 - c));

                        // then quit
                        total_gap += forward_stream.size * 2 - c;
                        c = forward_stream.size * 2;
                     }
                     else
                     {
                        if (forward_stream.sample_size == 8)
                        {
                           index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number,
                                                                      index_track, forward_stream.sample);

                           if (index_track > imge_item.start_bit_pos && index_track < imge_item.start_bit_pos + 16)
                           {
                           }

                           total_gap += 16;
                        }
                        else
                        {
                        }
                     }
                  }
               }
               // Between these two :
               {
                  if (forward_stream.size * 2 + backward_stream.size * 2 < gap_bits)
                  {
                     int nb_bytes = (gap_bits - (forward_stream.size * 2 + backward_stream.size * 2));
                     for (int gp = 0; gp < nb_bytes; gp += 16)
                     {
                        if (gp + 16 > nb_bytes)
                        {
                           // Add what we need to
                           index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number,
                                                                      index_track, 0x4E, (nb_bytes - gp));

                           // then quit
                           total_gap += nb_bytes - gp;
                        }
                        else
                        {
                           index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number,
                                                                      index_track, 0x4E);
                           total_gap += 16;
                        }

                        if (index_track > imge_item.start_bit_pos && index_track < imge_item.start_bit_pos + 16)
                        {
                        }
                     }
                  }
               }

               // Backward stream ?
               if (backward_gap)
               {
                  // First byte (or any part of it)
                  unsigned int c = 0;
                  if (backward_stream.size % 8 != 0)
                  {
                     // TODO
                     c = backward_stream.size % 8;
                     index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number, index_track,
                                                                backward_stream.sample, c);
                  }
                  for (; c < backward_stream.size * 2; c += 16)
                  {
                     if (backward_stream.size * 2 - c < 16)
                     {
                        // Add what we need to
                        index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number, index_track,
                                                                   backward_stream.sample,
                                                                   (backward_stream.size * 2 - c));

                        // then quit
                        total_gap += backward_stream.size * 2 - c;
                        c = backward_stream.size * 2;
                     }
                     else
                     {
                        if (backward_stream.sample_size == 8)
                        {
                           index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number,
                                                                      index_track, backward_stream.sample);

                           if (index_track > imge_item.start_bit_pos && index_track < imge_item.start_bit_pos + 16)
                           {
                           }

                           total_gap += 16;
                        }
                        else
                        {
                        }
                     }
                  }
               }
            }
            if (total_gap != gap_bits)
            {
            }
            //else
            total_total += total_gap;
         }

         // Check index / size
         if (index_track != imge_item.start_bit_pos || total_total != disk->side_[imge_item.side].tracks[imge_item.
            track_number].size)
         {
         }
      }
   }

   return true;
}